

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_queue.h
# Opt level: O1

bool __thiscall myutils::ShmemQueue::pop(ShmemQueue *this)

{
  long lVar1;
  long lVar2;
  int32_t iVar3;
  bool bVar4;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  do {
    LOCK();
    bVar4 = (this->m_rw_mtx).super___atomic_base<int>._M_i == 0;
    if (bVar4) {
      (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
    }
    UNLOCK();
    if (bVar4) {
      if (this->m_read_pos < this->m_write_pos) {
        this->m_read_pos = *(int *)(this->m_data + this->m_read_pos) + this->m_read_pos + 4;
        if (this->m_write_pos < this->m_read_pos) {
          __assert_fail("m_read_pos <= m_write_pos",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/shm_queue.h"
                        ,0x8e,"bool myutils::ShmemQueue::pop()");
        }
        if (this->m_read_pos == this->m_write_pos) {
          this->m_write_pos = 0;
          iVar3 = this->m_write_pos;
LAB_0014b9db:
          this->m_read_pos = iVar3;
          this->m_data_size = this->m_data_realsize;
        }
      }
      else if (this->m_write_pos < this->m_read_pos) {
        this->m_read_pos = *(int *)(this->m_data + this->m_read_pos) + this->m_read_pos + 4;
        if (this->m_data_size < this->m_read_pos) {
          __assert_fail("m_read_pos <= m_data_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/shm_queue.h"
                        ,0x96,"bool myutils::ShmemQueue::pop()");
        }
        iVar3 = 0;
        if (this->m_read_pos == this->m_data_size) goto LAB_0014b9db;
      }
      LOCK();
      (this->m_rw_mtx).super___atomic_base<int>._M_i =
           (this->m_rw_mtx).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (bVar4) {
        return false;
      }
    }
    lVar2 = std::chrono::_V2::system_clock::now();
    if (9999999 < lVar2 - lVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool ShmemQueue::pop()
    {
        bool ret = false;
        auto begin_time = system_clock::now();
        do {
            int32_t v = 0;
            if (m_rw_mtx.compare_exchange_strong(v, 1)) {
                char* p = m_data + m_read_pos;
                int32_t pkt_size = *(int32_t*)p;

                if (m_read_pos < m_write_pos) {
                    m_read_pos += pkt_size + 4;
                    assert(m_read_pos <= m_write_pos);
                    if (m_read_pos == m_write_pos) {
                        m_read_pos = m_write_pos = 0;
                        m_data_size = m_data_realsize; // Just ensure
                    }
                }
                else if (m_read_pos > m_write_pos) {
                    m_read_pos += pkt_size + 4;
                    assert(m_read_pos <= m_data_size);
                    if (m_read_pos == m_data_size) {
                        m_read_pos = 0;
                        m_data_size = m_data_realsize;
                    }
                }

                m_rw_mtx--;
                return ret;
            }
        } while (system_clock::now() - begin_time < milliseconds(10));

        return false;
    }